

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O1

size_t cmsysBase64_Decode(uchar *input,size_t length,uchar *output,size_t max_input_length)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  size_t sVar3;
  uchar *src;
  uchar *puVar4;
  uchar *dest;
  size_t unaff_R15;
  uchar temp [3];
  uchar temp_1 [3];
  undefined8 uStack_38;
  
  dest = output;
  uStack_38 = in_RAX;
  if (max_input_length == 0) {
    do {
      puVar4 = output + (length - (long)dest);
      if ((long)puVar4 < 3) {
        sVar3 = unaff_R15;
        if (puVar4 == (uchar *)0x1) {
          iVar2 = cmsysBase64_Decode3(input,(uchar *)((long)&uStack_38 + 5));
          if (iVar2 == 0) break;
        }
        else {
          if (puVar4 != (uchar *)0x2) break;
          uVar1 = cmsysBase64_Decode3(input,(uchar *)((long)&uStack_38 + 2));
          if (1 < uVar1) {
            *dest = uStack_38._2_1_;
            dest[1] = uStack_38._3_1_;
            dest = dest + 2;
            break;
          }
          uStack_38._5_1_ = uStack_38._2_1_;
          if (uVar1 != 1) break;
        }
        *dest = uStack_38._5_1_;
        dest = dest + 1;
        break;
      }
      uVar1 = cmsysBase64_Decode3(input,dest);
      dest = dest + uVar1;
      sVar3 = (long)dest - (long)output;
      input = input + 4;
    } while (uVar1 == 3);
    if (2 < (long)puVar4) {
      return sVar3;
    }
  }
  else {
    puVar4 = input;
    do {
      src = puVar4;
      sVar3 = unaff_R15;
      if (input + max_input_length <= src) break;
      uVar1 = cmsysBase64_Decode3(src,dest);
      dest = dest + uVar1;
      sVar3 = (long)dest - (long)output;
      puVar4 = src + 4;
    } while (uVar1 == 3);
    if (src < input + max_input_length) {
      return sVar3;
    }
  }
  return (long)dest - (long)output;
}

Assistant:

size_t kwsysBase64_Decode(const unsigned char *input,
                          size_t length,
                          unsigned char *output,
                          size_t max_input_length)
{
  const unsigned char *ptr = input;
  unsigned char *optr = output;

  /* Decode complete triplet */

  if (max_input_length)
    {
    const unsigned char *end = input + max_input_length;
    while (ptr < end)
      {
      int len = kwsysBase64_Decode3(ptr, optr);
      optr += len;
      if(len < 3)
        {
        return (size_t)(optr - output);
        }
      ptr += 4;
      }
    } 
  else 
    {
    unsigned char *oend = output + length;
    while ((oend - optr) >= 3)
      {
      int len = kwsysBase64_Decode3(ptr, optr);
      optr += len;
      if(len < 3)
        {
        return (size_t)(optr - output);
        }
      ptr += 4;
      }

    /* Decode the last triplet */
  
    if (oend - optr == 2)
      {
      unsigned char temp[3];
      int len = kwsysBase64_Decode3(ptr, temp);
      if(len >= 2)
        {
        optr[0] = temp[0];
        optr[1] = temp[1];
        optr += 2;
        }
      else if(len > 0)
        {
        optr[0] = temp[0];
        optr += 1;
        }
      }
    else if (oend - optr == 1)
      {
      unsigned char temp[3];
      int len = kwsysBase64_Decode3(ptr, temp);
      if(len > 0)
        {
        optr[0] = temp[0];
        optr += 1;
        }
      }
    }

  return (size_t)(optr - output);
}